

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O3

PaError ReadStream(PaStream *s,void *buffer,unsigned_long frames)

{
  undefined8 uVar1;
  int iVar2;
  unsigned_long numFrames;
  PaError PVar3;
  void *__dest;
  long lVar4;
  char *format;
  int xrun;
  unsigned_long framesGot;
  unsigned_long framesAvail;
  int local_5c;
  undefined8 local_58;
  unsigned_long local_50;
  PaError local_44;
  void *local_40;
  ulong local_38;
  
  lVar4 = *(long *)((long)s + 0x2c0);
  uVar1 = *(undefined8 *)((long)s + 0x340);
  if (lVar4 == 0) {
    PaUtil_DebugPrint(
                     "Expression \'stream->capture.pcm\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4495\n"
                     );
  }
  *(undefined8 *)((long)s + 0x340) = 0;
  PVar3 = 0;
  if (0.0 < *(double *)((long)s + 0x280)) {
    *(undefined8 *)((long)s + 0x280) = 0;
    PVar3 = -0x26fd;
  }
  __dest = buffer;
  if (*(int *)((long)s + 0x298) == 0) {
    __dest = *(void **)((long)s + 0x2e8);
    memcpy(__dest,buffer,(long)*(int *)((long)s + 0x290) << 3);
    lVar4 = *(long *)((long)s + 0x2c0);
  }
  local_40 = __dest;
  iVar2 = snd_pcm_state(lVar4);
  local_58 = uVar1;
  if ((iVar2 == 2) && (iVar2 = snd_pcm_start(*(undefined8 *)((long)s + 0x2c0)), iVar2 < 0)) {
    ReadStream_cold_2();
    local_44 = -9999;
  }
  else {
    local_44 = PVar3;
    if (frames != 0) {
      do {
        local_5c = 0;
        paUtilErr_ = PaAlsaStream_WaitForFrames((PaAlsaStream *)s,&local_38,&local_5c);
        if (paUtilErr_ < 0) {
          format = 
          "Expression \'PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4526\n"
          ;
LAB_0010fa34:
          PaUtil_DebugPrint(format);
        }
        if (local_5c == 0) {
          local_50 = local_38;
          if (frames <= local_38) {
            local_50 = frames;
          }
          paUtilErr_ = PaAlsaStream_SetUpBuffers((PaAlsaStream *)s,&local_50,&local_5c);
          if (paUtilErr_ < 0) {
            format = 
            "Expression \'PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4545\n"
            ;
            goto LAB_0010fa34;
          }
          if (local_50 != 0) {
            numFrames = PaUtil_CopyInput((PaUtilBufferProcessor *)((long)s + 0x68),&local_40,
                                         local_50);
            local_50 = numFrames;
            paUtilErr_ = PaAlsaStream_EndProcessing((PaAlsaStream *)s,numFrames,&local_5c);
            if (paUtilErr_ < 0) {
              format = 
              "Expression \'PaAlsaStream_EndProcessing( stream, framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4549\n"
              ;
              goto LAB_0010fa34;
            }
            frames = frames - numFrames;
          }
        }
        else {
          iVar2 = snd_pcm_state(*(undefined8 *)((long)s + 0x2c0));
          if ((iVar2 == 2) && (iVar2 = snd_pcm_start(*(undefined8 *)((long)s + 0x2c0)), iVar2 < 0))
          {
            ReadStream_cold_1();
            local_44 = -9999;
            break;
          }
        }
      } while (frames != 0);
    }
  }
  *(undefined8 *)((long)s + 0x340) = local_58;
  return local_44;
}

Assistant:

static PaError ReadStream( PaStream* s,
                           void *buffer,
                           unsigned long frames )
{
    PaSkeletonStream *stream = (PaSkeletonStream*)s;

    /* suppress unused variable warnings */
    (void) buffer;
    (void) frames;
    (void) stream;

    /* IMPLEMENT ME, see portaudio.h for required behavior*/

    return paNoError;
}